

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.c
# Opt level: O1

uint32_t chck_utf8_codepoint(char *u8)

{
  byte bVar1;
  char cVar2;
  uint32_t uVar3;
  long lVar4;
  uint32_t uVar5;
  uint uVar6;
  
  if (u8 == (char *)0x0) {
    __assert_fail("u8",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/unicode/unicode.c"
                  ,0x87,"uint32_t chck_utf8_codepoint(const char *)");
  }
  uVar5 = (uint32_t)*u8;
  lVar4 = 0;
  do {
    if (((&DAT_00102390)[lVar4] & *u8) == (&DAT_00102391)[lVar4]) {
      cVar2 = (&UNK_00102392)[lVar4];
      goto LAB_00101402;
    }
    lVar4 = lVar4 + 3;
  } while (lVar4 != 0xf);
  cVar2 = '\0';
LAB_00101402:
  if (cVar2 != '\0') {
    lVar4 = 0;
    uVar6 = 0;
    do {
      bVar1 = u8[lVar4];
      if (uVar6 == 0) {
        uVar5 = 0xffU >> (""[bVar1] & 0x1f) & (uint)bVar1;
      }
      else {
        uVar5 = uVar5 << 6 | bVar1 & 0x3f;
      }
      uVar6 = (uint)""[(ulong)""[bVar1] + (ulong)(uVar6 << 4) + 0x100];
      if (uVar6 == 1) {
        return 0xfffd;
      }
      lVar4 = lVar4 + 1;
    } while (cVar2 != (char)lVar4);
  }
  uVar3 = 0xfffd;
  if (cVar2 != '\0') {
    uVar3 = uVar5;
  }
  return uVar3;
}

Assistant:

uint32_t
chck_utf8_codepoint(const char u8[4])
{
   assert(u8);

   const uint8_t mb = chck_utf8_mblen(u8);
   uint32_t state = CHCK_UTF8_ACCEPT, cp = u8[0];
   for (uint8_t i = 0; i < mb; ++i) {
      if (chck_utf8_decode(&state, &cp, u8[i]) == CHCK_UTF8_REJECT)
         return CHCK_REPLACEMENT_CHAR;
   }

   return (mb > 0 ? cp : CHCK_REPLACEMENT_CHAR);
}